

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

char * nlohmann::detail::to_chars<double>(char *first,char *last,double value)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  size_t __n;
  char *pcVar6;
  char *pcVar7;
  size_t __n_00;
  int iVar8;
  int decimal_exponent;
  int len;
  int local_28 [2];
  
  if ((long)value < 0) {
    value = (double)((ulong)value ^ (ulong)DAT_001210c0);
    *first = '-';
    first = first + 1;
  }
  if ((value != 0.0) || (NAN(value))) {
    local_28[0] = 0;
    local_28[1] = 0;
    dtoa_impl::grisu2<double>(first,local_28 + 1,local_28,value);
    iVar2 = local_28[1];
    __n_00 = (size_t)local_28[1];
    __n = (size_t)local_28[0];
    uVar1 = __n + __n_00;
    iVar8 = (int)uVar1;
    if (((long)__n < 0) || (0xf < iVar8)) {
      if (iVar8 - 0x10U < 0xfffffff1) {
        if (iVar8 + 3U < 4) {
          memmove(first + (2U - iVar8),first,__n_00);
          first[0] = '0';
          first[1] = '.';
          memset(first + 2,0x30,(ulong)(uint)-iVar8);
          pcVar6 = first + (int)((2U - iVar8) + iVar2);
        }
        else {
          if (local_28[1] != 1) {
            memmove(first + 2,first + 1,__n_00 - 1);
            first[1] = '.';
            first = first + __n_00;
          }
          first[1] = 'e';
          uVar5 = iVar8 - 1;
          uVar3 = -uVar5;
          if (0 < (int)uVar5) {
            uVar3 = uVar5;
          }
          first[2] = (iVar8 < 1) * '\x02' + '+';
          if (uVar3 < 10) {
            first[3] = '0';
          }
          else {
            if (99 < uVar3) {
              first[3] = (char)(uVar3 / 100) + '0';
              bVar4 = (byte)((ulong)(uVar3 % 100) * 0x1999999a >> 0x20);
              first[4] = bVar4 | 0x30;
              first[5] = (char)(uVar3 % 100) + bVar4 * -10 | 0x30;
              return first + 6;
            }
            first[3] = (byte)((ulong)uVar3 / 10) | 0x30;
            uVar3 = uVar3 + (uVar3 / 10 + uVar3 / 10) * -5;
          }
          first[4] = (byte)uVar3 | 0x30;
          pcVar6 = first + 5;
        }
      }
      else {
        memmove(first + (uVar1 & 0xffffffff) + 1,first + (uVar1 & 0xffffffff),(long)-local_28[0]);
        first[uVar1 & 0xffffffff] = '.';
        pcVar6 = first + __n_00 + 1;
      }
    }
    else {
      memset(first + __n_00,0x30,__n);
      pcVar7 = first + uVar1;
      pcVar6 = pcVar7 + 2;
      pcVar7[0] = '.';
      pcVar7[1] = '0';
    }
  }
  else {
    first[0] = '0';
    first[1] = '.';
    first[2] = '0';
    pcVar6 = first + 3;
  }
  return pcVar6;
}

Assistant:

char* to_chars(char* first, char* last, FloatType value)
{
    static_cast<void>(last); // maybe unused - fix warning
    assert(std::isfinite(value));

    // Use signbit(value) instead of (value < 0) since signbit works for -0.
    if (std::signbit(value))
    {
        value = -value;
        *first++ = '-';
    }

    if (value == 0) // +-0
    {
        *first++ = '0';
        // Make it look like a floating-point number (#362, #378)
        *first++ = '.';
        *first++ = '0';
        return first;
    }

    assert(last - first >= std::numeric_limits<FloatType>::max_digits10);

    // Compute v = buffer * 10^decimal_exponent.
    // The decimal digits are stored in the buffer, which needs to be interpreted
    // as an unsigned decimal integer.
    // len is the length of the buffer, i.e. the number of decimal digits.
    int len = 0;
    int decimal_exponent = 0;
    dtoa_impl::grisu2(first, len, decimal_exponent, value);

    assert(len <= std::numeric_limits<FloatType>::max_digits10);

    // Format the buffer like printf("%.*g", prec, value)
    constexpr int kMinExp = -4;
    // Use digits10 here to increase compatibility with version 2.
    constexpr int kMaxExp = std::numeric_limits<FloatType>::digits10;

    assert(last - first >= kMaxExp + 2);
    assert(last - first >= 2 + (-kMinExp - 1) + std::numeric_limits<FloatType>::max_digits10);
    assert(last - first >= std::numeric_limits<FloatType>::max_digits10 + 6);

    return dtoa_impl::format_buffer(first, len, decimal_exponent, kMinExp, kMaxExp);
}